

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O0

IVec2 __thiscall
deqp::gles3::Functional::TriangleDerivateCase::getViewportSize(TriangleDerivateCase *this)

{
  int iVar1;
  int iVar2;
  RenderTarget *pRVar3;
  long in_RSI;
  int height;
  int width;
  TriangleDerivateCase *this_local;
  
  if (*(int *)(in_RSI + 0xe8) == 0) {
    pRVar3 = gles3::Context::getRenderTarget(*(Context **)(in_RSI + 0x70));
    iVar1 = tcu::RenderTarget::getWidth(pRVar3);
    iVar1 = de::min<int>(iVar1,0xa7);
    pRVar3 = gles3::Context::getRenderTarget(*(Context **)(in_RSI + 0x70));
    iVar2 = tcu::RenderTarget::getHeight(pRVar3);
    iVar2 = de::min<int>(iVar2,0x67);
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)this,iVar1,iVar2);
  }
  else {
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)this,99,0x85);
  }
  return (IVec2)(int  [2])this;
}

Assistant:

inline tcu::IVec2 TriangleDerivateCase::getViewportSize (void) const
{
	if (m_surfaceType == SURFACETYPE_DEFAULT_FRAMEBUFFER)
	{
		const int	width	= de::min<int>(m_context.getRenderTarget().getWidth(),	VIEWPORT_WIDTH);
		const int	height	= de::min<int>(m_context.getRenderTarget().getHeight(),	VIEWPORT_HEIGHT);
		return tcu::IVec2(width, height);
	}
	else
		return tcu::IVec2(FBO_WIDTH, FBO_HEIGHT);
}